

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alldiff.cpp
# Opt level: O2

bool __thiscall AllDiffDomain<4>::check(AllDiffDomain<4> *this)

{
  uint uVar1;
  void *pvVar2;
  int64_t iVar3;
  bool bVar4;
  uint uVar5;
  int i;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  uVar5 = this->sz;
  if (uVar5 == 0) {
    bVar4 = true;
  }
  else {
    uVar8 = 0;
    uVar1 = 0xffffffff;
    if (-1 < (int)uVar5) {
      uVar1 = uVar5;
    }
    uVar6 = 0;
    if (0 < (int)uVar5) {
      uVar6 = (ulong)uVar5;
    }
    pvVar2 = operator_new__((long)(int)uVar1);
    for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
      *(undefined1 *)((long)pvVar2 + uVar8) = 0;
    }
    lVar9 = 0;
    for (lVar7 = 0; bVar4 = (int)uVar5 <= lVar7, lVar7 < (int)uVar5; lVar7 = lVar7 + 1) {
      iVar3 = IntView<4>::getShadowVal((IntView<4> *)((long)&this->x->var + lVar9));
      if (*(char *)((long)pvVar2 + iVar3) != '\0') break;
      iVar3 = IntView<4>::getShadowVal((IntView<4> *)((long)&this->x->var + lVar9));
      *(undefined1 *)((long)pvVar2 + iVar3) = 1;
      uVar5 = this->sz;
      lVar9 = lVar9 + 0x10;
    }
    operator_delete__(pvVar2);
  }
  return bVar4;
}

Assistant:

bool check() override {
		if (sz == 0) {
			return true;
		}
		bool* taken = new bool[sz];
		//		bool taken[sz];
		for (int i = 0; i < sz; i++) {
			taken[i] = false;
		}
		for (int i = 0; i < sz; i++) {
			if (taken[x[i].getShadowVal()]) {
				delete[] taken;
				return false;
			}
			taken[x[i].getShadowVal()] = true;
		}
		delete[] taken;
		return true;
	}